

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superenalotto.cpp
# Opt level: O1

int main(void)

{
  unsigned_long __res;
  ulong uVar1;
  undefined8 *puVar2;
  result_type rVar3;
  ostream *poVar4;
  size_t __i;
  long lVar5;
  value_type *__val;
  long lVar6;
  mt19937 mt_rand;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar5 = 1;
  uVar1 = local_13b8._M_x[0];
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar5);
    local_13b8._M_x[lVar5] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_13b8._M_p = 0x270;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Numeri Superenalotto",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&local_13b8);
      *(int *)((long)puVar2 + lVar6) = (int)rVar3 + (int)(rVar3 / 0x5a) * -0x5a + 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar2 + 3,4);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar2 + 3);
    lVar6 = 0;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)puVar2 + lVar6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  operator_delete(puVar2,0x18);
  return 0;
}

Assistant:

int main() {
    std::mt19937 mt_rand(time(0));
    std::vector<int> gigi(6);

    std::cout << "Numeri Superenalotto" << std::endl;

    for (auto i : {0,0,0,0})
    {
        std::generate (gigi.begin(), gigi.end(), [&mt_rand] { return (mt_rand() % 90) + 1; });
        std::sort (gigi.begin(), gigi.end());
        for (auto& j : gigi)
        {
            std::cout << j << " ";
        }
        std::cout << std::endl;
    }
}